

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O0

void ChangeState(WebPWorker *worker,WebPWorkerStatus new_status)

{
  pthread_mutex_t *__mutex;
  int in_ESI;
  undefined8 *in_RDI;
  WebPWorkerImpl *impl;
  
  __mutex = (pthread_mutex_t *)*in_RDI;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
    if (*(int *)(in_RDI + 1) != 0) {
      while (*(int *)(in_RDI + 1) != 1) {
        pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
      }
      if (in_ESI != 1) {
        *(int *)(in_RDI + 1) = in_ESI;
        pthread_mutex_unlock(__mutex);
        pthread_cond_signal((pthread_cond_t *)(__mutex + 1));
        return;
      }
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

static void ChangeState(WebPWorker* const worker, WebPWorkerStatus new_status) {
  // No-op when attempting to change state on a thread that didn't come up.
  // Checking status_ without acquiring the lock first would result in a data
  // race.
  WebPWorkerImpl* const impl = (WebPWorkerImpl*)worker->impl_;
  if (impl == NULL) return;

  pthread_mutex_lock(&impl->mutex_);
  if (worker->status_ >= OK) {
    // wait for the worker to finish
    while (worker->status_ != OK) {
      pthread_cond_wait(&impl->condition_, &impl->mutex_);
    }
    // assign new status and release the working thread if needed
    if (new_status != OK) {
      worker->status_ = new_status;
      // Note the associated mutex does not need to be held when signaling the
      // condition. Unlocking the mutex first may improve performance in some
      // implementations, avoiding the case where the waiting thread can't
      // reacquire the mutex when woken.
      pthread_mutex_unlock(&impl->mutex_);
      pthread_cond_signal(&impl->condition_);
      return;
    }
  }
  pthread_mutex_unlock(&impl->mutex_);
}